

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coalesce.c
# Opt level: O2

int inform_coalesce(int *series,size_t n,int *coal,inform_error *err)

{
  size_t i;
  undefined4 *__dest;
  size_t sVar1;
  undefined4 *__ptr;
  void *pvVar2;
  size_t sVar3;
  uint uVar4;
  
  if (series != (int *)0x0) {
    if (n == 0) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_ESHORTSERIES;
      return 0;
    }
    if (coal != (int *)0x0) {
      __dest = (undefined4 *)malloc(n * 4);
      if (__dest == (undefined4 *)0x0) {
        if (err == (inform_error *)0x0) {
          return 0;
        }
        *err = INFORM_ENOMEM;
        return 0;
      }
      memcpy(__dest,series,n * 4);
      qsort(__dest,n,4,compare_ints);
      uVar4 = 1;
      for (sVar1 = 1; n != sVar1; sVar1 = sVar1 + 1) {
        uVar4 = uVar4 + (__dest[sVar1] != __dest[sVar1 - 1]);
      }
      __ptr = (undefined4 *)malloc((ulong)uVar4 * 4);
      if (__ptr == (undefined4 *)0x0) {
        free(__dest);
        if (err == (inform_error *)0x0) {
          return 0;
        }
        *err = INFORM_ENOMEM;
        return 0;
      }
      *__ptr = *__dest;
      sVar1 = 1;
      sVar3 = sVar1;
      for (; n != sVar1; sVar1 = sVar1 + 1) {
        if (__dest[sVar1] != __dest[sVar1 - 1]) {
          __ptr[sVar3] = __dest[sVar1];
          sVar3 = sVar3 + 1;
        }
      }
      free(__dest);
      sVar1 = 0;
      while( true ) {
        if (n == sVar1) {
          free(__ptr);
          return uVar4;
        }
        pvVar2 = bsearch(series,__ptr,(ulong)uVar4,4,compare_ints);
        if (pvVar2 == (void *)0x0) break;
        coal[sVar1] = (int)((ulong)((long)pvVar2 - (long)__ptr) >> 2);
        sVar1 = sVar1 + 1;
        series = series + 1;
      }
      free(__ptr);
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_EBIN;
      return 0;
    }
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ETIMESERIES;
  }
  return 0;
}

Assistant:

int inform_coalesce(int const *series, size_t n, int *coal, inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (coal == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    int *tmp = malloc(n * sizeof(int));
    if (tmp == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, 0);
    }
    memcpy(tmp, series, n * sizeof(int));
    qsort(tmp, n, sizeof(int), compare_ints);
    int b = 1;
    for (size_t i = 1; i < n; ++i)
    {
        if (tmp[i] != tmp[i-1]) ++b;
    }

    int *map = malloc(b * sizeof(int));
    if (map == NULL)
    {
        free(tmp);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, 0);
    }
    map[0] = tmp[0];
    for (size_t i = 1, j = 1; i < n; ++i)
    {
        if (tmp[i] != tmp[i-1]) map[j++] = tmp[i];
    }
    free(tmp);

    for (size_t i = 0; i < n; ++i)
    {
        int *x = bsearch(series + i, map, b, sizeof(int), compare_ints);
        if (x == NULL)
        {
            free(map);
            INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
        }
        coal[i] = (int) (x - map);
    }

    free(map);
    return b;
}